

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

duration<double,_std::ratio<1L,_1L>_>
bench_cpp(int n,string_view path,string_view fname,bool verbose)

{
  string_view func;
  string_view path_00;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __args;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  basic_string_view<char,_std::char_traits<char>_> __args_00;
  initializer_list<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  __l;
  int n_00;
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  char *t_00;
  bool bVar5;
  pointer ppVar6;
  bool *pbVar7;
  ostream *poVar8;
  basic_ostream<char,_std::char_traits<char>_> *pbVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  duration<double,_std::ratio<1L,_1L>_> *pdVar11;
  __sv_type w;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  *local_5c8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_580;
  duration<double,_std::ratio<1L,_1L>_> local_578;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_570;
  time_point t1;
  undefined1 local_540 [8];
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  result_1;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
  local_510;
  iterator it_1;
  time_point t0;
  int i;
  undefined1 local_4a8 [8];
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  result;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
  local_478;
  iterator it;
  undefined1 local_468 [7];
  bool b;
  string h;
  key_equal local_440;
  hasher local_43f;
  anon_class_1_0_00000001 local_43e;
  anon_class_1_0_00000001 local_43d;
  anon_class_1_0_00000001 local_43c;
  anon_class_1_0_00000001 local_43b;
  anon_class_1_0_00000001 local_43a;
  anon_class_1_0_00000001 local_439;
  anon_class_1_0_00000001 local_438;
  anon_class_1_0_00000001 local_437;
  anon_class_1_0_00000001 local_436;
  anon_class_1_0_00000001 local_435;
  anon_class_1_0_00000001 local_434;
  anon_class_1_0_00000001 local_433;
  anon_class_1_0_00000001 local_432;
  anon_class_1_0_00000001 local_431;
  anon_class_1_0_00000001 local_430;
  anon_class_1_0_00000001 local_42f;
  anon_class_1_0_00000001 local_42e;
  anon_class_1_0_00000001 local_42d [20];
  anon_class_1_0_00000001 local_419;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  *local_418;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  local_410;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  local_3e0;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  local_3b0;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  local_380;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  local_350;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  local_320;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  local_2f0;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  local_2c0;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  local_290;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  local_260;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  local_230;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  local_200;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  local_1d0;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  local_1a0;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  local_170;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  local_140;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  local_110;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  local_e0;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  local_b0;
  undefined1 local_80 [24];
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  fs_function_map;
  undefined1 uStack_30;
  bool expand_tilde;
  bool strict;
  bool verbose_local;
  int n_local;
  string_view fname_local;
  string_view path_local;
  duration<double,_std::ratio<1L,_1L>_> t;
  
  fname_local._M_len = (size_t)fname._M_str;
  _uStack_30 = fname._M_len;
  path_local._M_len = (size_t)path._M_str;
  fname_local._M_str = (char *)path._M_len;
  path_local._M_str = (char *)0x7fefffffffffffff;
  fs_function_map._M_h._M_single_bucket._2_1_ = 0;
  fs_function_map._M_h._M_single_bucket._1_1_ = 0;
  local_418 = &local_410;
  fs_function_map._M_h._M_single_bucket._3_1_ = verbose;
  fs_function_map._M_h._M_single_bucket._4_4_ = n;
  std::
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  ::
  pair<const_char_(&)[10],_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_scivision[P]fortran_filesystem_app_benchmark_cpp:44:17),_true>
            (local_418,(char (*) [10])0x125c0d,&local_419);
  local_418 = &local_3e0;
  std::
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  ::
  pair<const_char_(&)[8],_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_scivision[P]fortran_filesystem_app_benchmark_cpp:45:15),_true>
            (local_418,(char (*) [8])"resolve",local_42d);
  local_418 = &local_3b0;
  std::
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  ::
  pair<const_char_(&)[11],_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_scivision[P]fortran_filesystem_app_benchmark_cpp:46:18),_true>
            (local_418,(char (*) [11])"drop_slash",&local_42e);
  local_418 = &local_380;
  std::
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  ::
  pair<const_char_(&)[7],_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_scivision[P]fortran_filesystem_app_benchmark_cpp:47:14),_true>
            (local_418,(char (*) [7])"parent",&local_42f);
  local_418 = &local_350;
  std::
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  ::
  pair<const_char_(&)[10],_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_scivision[P]fortran_filesystem_app_benchmark_cpp:48:17),_true>
            (local_418,(char (*) [10])"file_name",&local_430);
  local_418 = &local_320;
  std::
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  ::
  pair<const_char_(&)[7],_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_scivision[P]fortran_filesystem_app_benchmark_cpp:49:14),_true>
            (local_418,(char (*) [7])"suffix",&local_431);
  local_418 = &local_2f0;
  std::
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  ::
  pair<const_char_(&)[7],_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_scivision[P]fortran_filesystem_app_benchmark_cpp:50:14),_true>
            (local_418,(char (*) [7])"normal",&local_432);
  local_418 = &local_2c0;
  std::
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  ::
  pair<const_char_(&)[9],_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_scivision[P]fortran_filesystem_app_benchmark_cpp:51:16),_true>
            (local_418,(char (*) [9])0x125696,&local_433);
  local_418 = &local_290;
  std::
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  ::
  pair<const_char_(&)[7],_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_scivision[P]fortran_filesystem_app_benchmark_cpp:52:14),_true>
            (local_418,(char (*) [7])"exists",&local_434);
  local_418 = &local_260;
  std::
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  ::
  pair<const_char_(&)[7],_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_scivision[P]fortran_filesystem_app_benchmark_cpp:53:14),_true>
            (local_418,(char (*) [7])"is_dir",&local_435);
  local_418 = &local_230;
  std::
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  ::
  pair<const_char_(&)[8],_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_scivision[P]fortran_filesystem_app_benchmark_cpp:54:15),_true>
            (local_418,(char (*) [8])"is_char",&local_436);
  local_418 = &local_200;
  std::
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  ::
  pair<const_char_(&)[8],_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_scivision[P]fortran_filesystem_app_benchmark_cpp:55:15),_true>
            (local_418,(char (*) [8])"is_file",&local_437);
  local_418 = &local_1d0;
  std::
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  ::
  pair<const_char_(&)[11],_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_scivision[P]fortran_filesystem_app_benchmark_cpp:56:18),_true>
            (local_418,(char (*) [11])0x125cd1,&local_438);
  local_418 = &local_1a0;
  std::
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  ::
  pair<const_char_(&)[13],_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_scivision[P]fortran_filesystem_app_benchmark_cpp:57:20),_true>
            (local_418,(char (*) [13])0x125c28,&local_439);
  local_418 = &local_170;
  std::
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  ::
  pair<const_char_(&)[6],_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_scivision[P]fortran_filesystem_app_benchmark_cpp:58:13),_true>
            (local_418,(char (*) [6])0x125c4a,&local_43a);
  local_418 = &local_140;
  std::
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  ::
  pair<const_char_(&)[8],_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_scivision[P]fortran_filesystem_app_benchmark_cpp:59:15),_true>
            (local_418,(char (*) [8])"homedir",&local_43b);
  local_418 = &local_110;
  std::
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  ::
  pair<const_char_(&)[11],_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_scivision[P]fortran_filesystem_app_benchmark_cpp:60:18),_true>
            (local_418,(char (*) [11])"expanduser",&local_43c);
  local_418 = &local_e0;
  std::
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  ::
  pair<const_char_(&)[4],_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_scivision[P]fortran_filesystem_app_benchmark_cpp:61:11),_true>
            (local_418,(char (*) [4])0x125bed,&local_43d);
  local_418 = &local_b0;
  std::
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
  ::
  pair<const_char_(&)[12],_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_scivision[P]fortran_filesystem_app_benchmark_cpp:62:19),_true>
            (local_418,(char (*) [12])"is_reserved",&local_43e);
  local_80._0_8_ = &local_410;
  local_80._8_8_ = (char *)0x13;
  std::
  allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  ::allocator((allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
               *)(h.field_2._M_local_buf + 0xf));
  __l._M_len = local_80._8_8_;
  __l._M_array = (iterator)local_80._0_8_;
  std::
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ::unordered_map((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                   *)(local_80 + 0x10),__l,0,&local_43f,&local_440,
                  (allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                   *)(h.field_2._M_local_buf + 0xf));
  std::
  allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  ::~allocator((allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                *)(h.field_2._M_local_buf + 0xf));
  local_5c8 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
               *)local_80;
  do {
    local_5c8 = local_5c8 + -1;
    std::
    pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>
    ::~pair(local_5c8);
  } while (local_5c8 != &local_410);
  std::__cxx11::string::string((string *)local_468);
  it.
  super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
  ._M_cur._7_1_ = 0;
  local_478._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
       ::find((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
               *)(local_80 + 0x10),(key_type *)&uStack_30);
  result.
  super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  .super__Move_assign_alias<std::__cxx11::basic_string<char>,_bool>.
  super__Copy_assign_alias<std::__cxx11::basic_string<char>,_bool>.
  super__Move_ctor_alias<std::__cxx11::basic_string<char>,_bool>.
  super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_bool>.
  super__Variant_storage_alias<std::__cxx11::basic_string<char>,_bool>._32_8_ =
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
       ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
              *)(local_80 + 0x10));
  bVar5 = std::__detail::operator==
                    (&local_478,
                     (_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
                      *)((long)&result.
                                super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                                .super__Move_assign_alias<std::__cxx11::basic_string<char>,_bool>.
                                super__Copy_assign_alias<std::__cxx11::basic_string<char>,_bool>.
                                super__Move_ctor_alias<std::__cxx11::basic_string<char>,_bool>.
                                super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_bool>.
                                super__Variant_storage_alias<std::__cxx11::basic_string<char>,_bool>
                        + 0x20));
  if (((bVar5 ^ 0xffU) & 1) == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error: unknown function ");
    __str_00._M_str = (char *)fname_local._M_len;
    __str_00._M_len = _uStack_30;
    pbVar9 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar8,__str_00);
    std::operator<<((ostream *)pbVar9,"\n");
    goto LAB_00107b18;
  }
  ppVar6 = std::__detail::
           _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_false,_true>
           ::operator->((_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_false,_true>
                         *)&local_478);
  __args_00._M_str = (char *)path_local._M_len;
  __args_00._M_len = (size_t)fname_local._M_str;
  std::
  function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  ::operator()((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                *)local_4a8,&ppVar6->second,__args_00);
  bVar5 = std::holds_alternative<std::__cxx11::string,std::__cxx11::string,bool>
                    ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                      *)local_4a8);
  if (bVar5) {
    pbVar10 = std::get<std::__cxx11::string,std::__cxx11::string,bool>
                        ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                          *)local_4a8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_468,
               pbVar10);
    bVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_468);
    if (!bVar5) goto LAB_00107793;
    poVar8 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
    __str_02._M_str = (char *)fname_local._M_len;
    __str_02._M_len = _uStack_30;
    pbVar9 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar8,__str_02);
    poVar8 = std::operator<<((ostream *)pbVar9," ");
    __str_01._M_str = (char *)path_local._M_len;
    __str_01._M_len = (size_t)fname_local._M_str;
    pbVar9 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar8,__str_01);
    std::operator<<((ostream *)pbVar9," failed on warmup\n");
    bVar5 = true;
  }
  else {
    pbVar7 = std::get<bool,std::__cxx11::string,bool>
                       ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                         *)local_4a8);
    it.
    super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
    ._M_cur._7_1_ = *pbVar7 & 1;
LAB_00107793:
    bVar5 = false;
  }
  std::
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  ~variant((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
            *)local_4a8);
  if (!bVar5) {
    for (t0.__d.__r._4_4_ = 0; t_00 = path_local._M_str, sVar4 = path_local._M_len,
        pcVar3 = fname_local._M_str, sVar2 = fname_local._M_len, sVar1 = _uStack_30,
        n_00 = fs_function_map._M_h._M_single_bucket._4_4_,
        t0.__d.__r._4_4_ < fs_function_map._M_h._M_single_bucket._4_4_;
        t0.__d.__r._4_4_ = t0.__d.__r._4_4_ + 1) {
      it_1.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
      ._M_cur = (_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
                 )std::chrono::_V2::steady_clock::now();
      local_510._M_cur =
           (__node_type *)
           std::
           unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
           ::find((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                   *)(local_80 + 0x10),(key_type *)&uStack_30);
      result_1.
      super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
      .super__Move_assign_alias<std::__cxx11::basic_string<char>,_bool>.
      super__Copy_assign_alias<std::__cxx11::basic_string<char>,_bool>.
      super__Move_ctor_alias<std::__cxx11::basic_string<char>,_bool>.
      super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_bool>.
      super__Variant_storage_alias<std::__cxx11::basic_string<char>,_bool>._32_8_ =
           std::
           unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
           ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                  *)(local_80 + 0x10));
      bVar5 = std::__detail::operator==
                        (&local_510,
                         (_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
                          *)((long)&result_1.
                                    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                                    .
                                    super__Move_assign_alias<std::__cxx11::basic_string<char>,_bool>
                                    .
                                    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_bool>
                                    .super__Move_ctor_alias<std::__cxx11::basic_string<char>,_bool>.
                                    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_bool>.
                                    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_bool>
                            + 0x20));
      if (((bVar5 ^ 0xffU) & 1) == 0) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error: unknown function ");
        t1.__d.__r = (duration)(duration)_uStack_30;
        __str._M_str = (char *)fname_local._M_len;
        __str._M_len = _uStack_30;
        pbVar9 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar8,__str);
        std::operator<<((ostream *)pbVar9,"\n");
        goto LAB_00107b18;
      }
      ppVar6 = std::__detail::
               _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_false,_true>
                             *)&local_510);
      __args._M_str = (char *)path_local._M_len;
      __args._M_len = (size_t)fname_local._M_str;
      std::
      function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>
      ::operator()((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                    *)local_540,&ppVar6->second,__args);
      bVar5 = std::holds_alternative<std::__cxx11::string,std::__cxx11::string,bool>
                        ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                          *)local_540);
      if (bVar5) {
        pbVar10 = std::get<std::__cxx11::string,std::__cxx11::string,bool>
                            ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                              *)local_540);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_468,
                   pbVar10);
      }
      else {
        pbVar7 = std::get<bool,std::__cxx11::string,bool>
                           ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                             *)local_540);
        it.
        super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
        ._M_cur._7_1_ = *pbVar7 & 1;
      }
      std::
      variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
      ::~variant((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                  *)local_540);
      local_570.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      local_580.__r =
           (rep)std::chrono::operator-
                          (&local_570,
                           (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)&it_1);
      local_578.__r =
           (rep_conflict)
           std::chrono::
           duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                     (&local_580);
      pdVar11 = std::min<std::chrono::duration<double,std::ratio<1l,1l>>>
                          ((duration<double,_std::ratio<1L,_1L>_> *)&path_local._M_str,&local_578);
      path_local._M_str = (char *)pdVar11->__r;
    }
    if ((fs_function_map._M_h._M_single_bucket._3_1_ & 1) != 0) {
      w = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_468);
      path_00._M_str = (char *)sVar4;
      path_00._M_len = (size_t)pcVar3;
      func._M_str = (char *)sVar2;
      func._M_len = sVar1;
      print_cpp((duration<double,_std::ratio<1L,_1L>_>)t_00,n_00,path_00,func,w,
                (bool)(it.
                       super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
                       ._M_cur._7_1_ & 1));
    }
  }
LAB_00107b18:
  std::__cxx11::string::~string((string *)local_468);
  std::
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ::~unordered_map((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                    *)(local_80 + 0x10));
  return (duration<double,_std::ratio<1L,_1L>_>)(rep_conflict)path_local._M_str;
}

Assistant:

std::chrono::duration<double> bench_cpp(int n, std::string_view path, std::string_view fname, bool verbose)
{

auto t = std::chrono::duration<double>::max();

constexpr bool strict = false;
constexpr bool expand_tilde = false;

using fs_function = std::function<std::variant<std::string, bool>(std::string_view)>;

std::unordered_map<std::string_view, fs_function> fs_function_map = {
  {"canonical", [=](std::string_view p) { return fs_canonical(p, strict, expand_tilde); }},
  {"resolve", [=](std::string_view p) { return fs_resolve(p, strict, expand_tilde); }},
  {"drop_slash", [](std::string_view p) { return fs_drop_slash(p); }},
  {"parent", [](std::string_view p) { return fs_parent(p); }},
  {"file_name", [](std::string_view p) { return fs_file_name(p); }},
  {"suffix", [](std::string_view p) { return fs_suffix(p); }},
  {"normal", [](std::string_view p) { return fs_normal(p); }},
  {"reserved", [](std::string_view p) { return fs_is_reserved(p); }},
  {"exists", [](std::string_view p) { return fs_exists(p); }},
  {"is_dir", [](std::string_view p) { return fs_is_dir(p); }},
  {"is_char", [](std::string_view p) { return fs_is_char_device(p); }},
  {"is_file", [](std::string_view p) { return fs_is_file(p); }},
  {"is_symlink", [](std::string_view p) { return fs_is_symlink(p); }},
  {"read_symlink", [](std::string_view p) { return fs_read_symlink(p); }},
  {"which", [](std::string_view p) { return fs_which(p); }},
  {"homedir", [](std::string_view) { return fs_get_homedir(); }},
  {"expanduser", [](std::string_view p) { return fs_expanduser(p); }},
  {"cwd", [](std::string_view) { return fs_get_cwd(); }},
  {"is_reserved", [](std::string_view p) { return fs_is_reserved(p); }}
};

// warmup
std::string h;
bool b = false;

  auto it = fs_function_map.find(fname);
  if (it != fs_function_map.end()) {
    auto result = it->second(path);
    if (std::holds_alternative<std::string>(result)){
      h = std::get<std::string>(result);
      if(h.empty()){
        std::cerr << "ERROR: " << fname << " " << path << " failed on warmup\n";
        return t;
      }
    } else
      b = std::get<bool>(result);
  } else {
    std::cerr << "Error: unknown function " << fname << "\n";
    return t;
  }

for (int i = 0; i < n; ++i)
{
  auto t0 = std::chrono::steady_clock::now();

  auto it = fs_function_map.find(fname);
  if (it != fs_function_map.end()) {
    auto result = it->second(path);
    if (std::holds_alternative<std::string>(result))
      h = std::get<std::string>(result);
    else
      b = std::get<bool>(result);
  } else {
    std::cerr << "Error: unknown function " << fname << "\n";
    return t;
  }

  auto t1 = std::chrono::steady_clock::now();
  t = std::min(t, std::chrono::duration_cast<std::chrono::duration<double>>(t1 - t0));
}

if(verbose)
  print_cpp(t, n, path, fname, h, b);

return t;
}